

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer-test.cc
# Opt level: O3

void __thiscall
Buffer_ensure_writable_when_readonly_Test::~Buffer_ensure_writable_when_readonly_Test
          (Buffer_ensure_writable_when_readonly_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Buffer, ensure_writable_when_readonly) {
    auto buf = bfy_buffer_init();
    bfy_buffer_add_readonly(&buf, std::data(str1), std::size(str1));
    EXPECT_EQ(0, bfy_buffer_get_space_len(&buf));
    EXPECT_EQ(std::size(str1), bfy_buffer_get_content_len(&buf));

    auto const n_available = 10;  // arbitrary
    EXPECT_EQ(0, bfy_buffer_ensure_space(&buf, n_available));
    EXPECT_EQ(std::size(str1), bfy_buffer_get_content_len(&buf));
    EXPECT_LE(n_available, bfy_buffer_get_space_len(&buf));

    bfy_buffer_destruct(&buf);
}